

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.h
# Opt level: O0

void __thiscall
pbrt::syntactic::BasicLexer<pbrt::syntactic::MappedFile>::~BasicLexer
          (BasicLexer<pbrt::syntactic::MappedFile> *this)

{
  ReadBuffer<std::shared_ptr<pbrt::syntactic::MappedFile>_>::~ReadBuffer
            ((ReadBuffer<std::shared_ptr<pbrt::syntactic::MappedFile>_> *)0x16720c);
  CharBuffer::~CharBuffer((CharBuffer *)0x167216);
  return;
}

Assistant:

struct PBRT_PARSER_INTERFACE BasicLexer {

      //! constructor
      BasicLexer(typename DataSource::SP ds) : buffer(ds) {}

      Token next();
      
    private:
      /*! utility class to assemble tokens. Provides a stream interface
        but is generally faster than e.g. std::stringstream */
      struct CharBuffer {
        CharBuffer(std::size_t reserved = 0)
          : data_(reserved)
        {
        }

        void operator<<(char c) { data_.push_back(c); }
        void clear() { data_.clear(); }
        std::string str() { return std::string(data_.data(), data_.size()); }
      private:
        std::vector<char> data_;
      };

      CharBuffer(ss);

      ReadBuffer<typename DataSource::SP> buffer;
    }